

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMetricNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  ValueType VVar1;
  DDLNode *pDVar2;
  int iVar3;
  int32 iVar4;
  DDLNode *pDVar5;
  Property *pPVar6;
  Value *this_00;
  char *__s;
  runtime_error *this_01;
  undefined1 *puVar7;
  size_t i;
  long lVar8;
  float fVar9;
  string valName;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if (((node != (DDLNode *)0x0) && (this->m_ctx != (Context *)0x0)) &&
     (pDVar2 = this->m_ctx->m_root, pDVar5 = ODDLParser::DDLNode::getParent(node), pDVar2 == pDVar5)
     ) {
    for (pPVar6 = ODDLParser::DDLNode::getProperties(node); pPVar6 != (Property *)0x0;
        pPVar6 = pPVar6->m_next) {
      if ((pPVar6->m_key != (Text *)0x0) && (pPVar6->m_value->m_type == ddl_string)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,(char *)pPVar6->m_value->m_data,(allocator<char> *)local_70);
        if (local_50[0] == (long *)0x0) {
          lVar8 = 0;
LAB_004b2752:
          this_00 = ODDLParser::DDLNode::getValue(node);
          if (this_00 != (Value *)0x0) {
            VVar1 = this_00->m_type;
            if (VVar1 == ddl_int32) {
              iVar4 = ODDLParser::Value::getInt32(this_00);
              this->m_metrics[lVar8].m_intValue = iVar4;
            }
            else if (VVar1 == ddl_string) {
              __s = ODDLParser::Value::getString(this_00);
              std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_71);
              std::__cxx11::string::operator=
                        ((string *)(this->m_metrics + lVar8),(string *)local_70);
              if (local_70[0] != local_60) {
                operator_delete(local_70[0],local_60[0] + 1);
              }
            }
            else {
              if (VVar1 != ddl_float) {
                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_70[0] = local_60;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_70,"OpenGEX: invalid data type for Metric node.","");
                std::runtime_error::runtime_error(this_01,(string *)local_70);
                *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
                __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              fVar9 = ODDLParser::Value::getFloat(this_00);
              this->m_metrics[lVar8].m_floatValue = fVar9;
            }
          }
        }
        else {
          puVar7 = Grammar::ValidMetricToken_abi_cxx11_;
          lVar8 = 0;
          do {
            iVar3 = std::__cxx11::string::compare(puVar7);
            if (iVar3 == 0) goto LAB_004b2752;
            lVar8 = lVar8 + 1;
            puVar7 = puVar7 + 0x20;
          } while (lVar8 != 4);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleMetricNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node || nullptr == m_ctx ) {
        return;
    }

    if( m_ctx->m_root != node->getParent() ) {
        return;
    }

    Property *prop( node->getProperties() );
    while( nullptr != prop ) {
        if( nullptr != prop->m_key ) {
            if( Value::ddl_string == prop->m_value->m_type ) {
                std::string valName( ( char* ) prop->m_value->m_data );
                int type( Grammar::isValidMetricType( valName.c_str() ) );
                if( Grammar::NoneType != type ) {
                    Value *val( node->getValue() );
                    if( nullptr != val ) {
                        if( Value::ddl_float == val->m_type ) {
                            m_metrics[ type ].m_floatValue = val->getFloat();
                        } else if( Value::ddl_int32 == val->m_type ) {
                            m_metrics[ type ].m_intValue = val->getInt32();
                        } else if( Value::ddl_string == val->m_type ) {
                            m_metrics[type].m_stringValue = std::string( val->getString() );
                        } else {
                            throw DeadlyImportError( "OpenGEX: invalid data type for Metric node." );
                        }
                    }
                }
            }
        }
        prop = prop->m_next;
    }
}